

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O2

void CP_WriterCloseHandler
               (CManager cm,CMConnection conn,void *Msg_v,void *client_data,attr_list attrs)

{
  SstStream s;
  void *__ptr;
  void *pvVar1;
  
  if (_perfstubs_initialized == 1) {
    pvVar1 = CP_WriterCloseHandler::timer;
    if (CP_WriterCloseHandler::timer == (void *)0x0) {
      __ptr = (void *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/cp/cp_reader.c"
                                          ,"CP_WriterCloseHandler",0x438);
      pvVar1 = (void *)ps_timer_create_(__ptr);
      CP_WriterCloseHandler::timer = pvVar1;
      free(__ptr);
    }
    ps_timer_start_(pvVar1);
  }
  s = *Msg_v;
  pthread_mutex_lock((pthread_mutex_t *)&s->DataLock);
  CP_verbose(s,PerStepVerbose,
             "Received a writer close message. timestep %ld was the final timestep.\n",
             *(undefined8 *)((long)Msg_v + 8));
  s->FinalTimestep = *(ssize_t *)((long)Msg_v + 8);
  s->Status = PeerClosed;
  pthread_cond_signal((pthread_cond_t *)&s->DataCondition);
  pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(CP_WriterCloseHandler::timer);
    return;
  }
  return;
}

Assistant:

extern void CP_WriterCloseHandler(CManager cm, CMConnection conn, void *Msg_v, void *client_data,
                                  attr_list attrs)
{
    PERFSTUBS_TIMER_START_FUNC(timer);
    WriterCloseMsg Msg = (WriterCloseMsg)Msg_v;
    SstStream Stream = (SstStream)Msg->RS_Stream;

    STREAM_MUTEX_LOCK(Stream);
    CP_verbose(Stream, PerStepVerbose,
               "Received a writer close message. "
               "timestep %ld was the final timestep.\n",
               Msg->FinalTimestep);

    Stream->FinalTimestep = Msg->FinalTimestep;
    Stream->Status = PeerClosed;
    /* wake anyone that might be waiting */
    STREAM_CONDITION_SIGNAL(Stream);
    STREAM_MUTEX_UNLOCK(Stream);
    PERFSTUBS_TIMER_STOP_FUNC(timer);
}